

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_ostream.cpp
# Opt level: O2

ssize_t __thiscall llvm::raw_ostream::write(raw_ostream *this,int __fd,void *__buf,size_t __n)

{
  char *pcVar1;
  undefined4 in_register_00000034;
  char *pcVar2;
  char *Size;
  char *Ptr;
  
  Ptr = (char *)CONCAT44(in_register_00000034,__fd);
LAB_0015b558:
  do {
    pcVar1 = this->OutBufCur;
    Size = this->OutBufEnd + -(long)pcVar1;
    pcVar2 = (char *)((long)__buf + -(long)Size);
    if (__buf < Size || pcVar2 == (char *)0x0) {
LAB_0015b5e7:
      copy_to_buffer(this,Ptr,(size_t)__buf);
      return (ssize_t)this;
    }
    if (this->OutBufStart != (char *)0x0) {
      if (pcVar1 == this->OutBufStart) {
        if (this->OutBufEnd == pcVar1) {
          __assert_fail("NumBytes != 0 && \"undefined behavior\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/raw_ostream.cpp"
                        ,0xf2,"raw_ostream &llvm::raw_ostream::write(const char *, size_t)");
        }
        pcVar2 = (char *)((ulong)__buf % (ulong)Size);
        Size = (char *)((long)__buf + -(long)pcVar2);
        (*this->_vptr_raw_ostream[7])(this,Ptr,Size);
        if (pcVar2 <= this->OutBufEnd + -(long)this->OutBufCur) {
          Ptr = Ptr + (long)Size;
          __buf = pcVar2;
          goto LAB_0015b5e7;
        }
      }
      else {
        copy_to_buffer(this,Ptr,(size_t)Size);
        flush_nonempty(this);
      }
      Ptr = Ptr + (long)Size;
      __buf = pcVar2;
      goto LAB_0015b558;
    }
    if (this->BufferMode == Unbuffered) {
      (*this->_vptr_raw_ostream[7])(this,Ptr,__buf);
      return (ssize_t)this;
    }
    SetBuffered(this);
  } while( true );
}

Assistant:

raw_ostream &raw_ostream::write(const char *Ptr, size_t Size) {
  // Group exceptional cases into a single branch.
  if (LLVM_UNLIKELY(size_t(OutBufEnd - OutBufCur) < Size)) {
    if (LLVM_UNLIKELY(!OutBufStart)) {
      if (BufferMode == Unbuffered) {
        write_impl(Ptr, Size);
        return *this;
      }
      // Set up a buffer and start over.
      SetBuffered();
      return write(Ptr, Size);
    }

    size_t NumBytes = OutBufEnd - OutBufCur;

    // If the buffer is empty at this point we have a string that is larger
    // than the buffer. Directly write the chunk that is a multiple of the
    // preferred buffer size and put the remainder in the buffer.
    if (LLVM_UNLIKELY(OutBufCur == OutBufStart)) {
      assert(NumBytes != 0 && "undefined behavior");
      size_t BytesToWrite = Size - (Size % NumBytes);
      write_impl(Ptr, BytesToWrite);
      size_t BytesRemaining = Size - BytesToWrite;
      if (BytesRemaining > size_t(OutBufEnd - OutBufCur)) {
        // Too much left over to copy into our buffer.
        return write(Ptr + BytesToWrite, BytesRemaining);
      }
      copy_to_buffer(Ptr + BytesToWrite, BytesRemaining);
      return *this;
    }

    // We don't have enough space in the buffer to fit the string in. Insert as
    // much as possible, flush and start over with the remainder.
    copy_to_buffer(Ptr, NumBytes);
    flush_nonempty();
    return write(Ptr + NumBytes, Size - NumBytes);
  }

  copy_to_buffer(Ptr, Size);

  return *this;
}